

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.cpp
# Opt level: O1

SyntaxNode * __thiscall
anon_unknown.dwarf_18fcd9e::CloneVisitor::visit<slang::syntax::TypeAssignmentSyntax>
          (CloneVisitor *this,TypeAssignmentSyntax *node)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  ChangeCollection *pCVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  undefined1 auVar9 [16];
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  TokenOrSyntax child;
  TokenOrSyntax child_00;
  int iVar14;
  undefined4 extraout_var;
  size_t sVar15;
  SyntaxNode *node_00;
  ulong uVar16;
  long lVar17;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *p_Var18;
  logic_error *plVar19;
  void *in_RCX;
  int in_EDX;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  size_t hash;
  ulong uVar23;
  ulong index;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var27;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> listBuffer;
  uint7 uStack_16f;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_168;
  char local_158;
  SyntaxNode *local_150;
  undefined8 uStack_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_138;
  undefined1 auStack_128 [8];
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_120;
  undefined1 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined1 local_f0 [192];
  TypeAssignmentSyntax *this_00;
  
  iVar14 = slang::syntax::clone((__fn *)node,this->alloc,in_EDX,in_RCX);
  this_00 = (TypeAssignmentSyntax *)CONCAT44(extraout_var,iVar14);
  local_108 = local_f0;
  local_100 = 0;
  local_f8 = 8;
  index = 0;
  do {
    sVar15 = slang::syntax::SyntaxNode::getChildCount(&node->super_SyntaxNode);
    if (sVar15 <= index) {
      if (local_108 != local_f0) {
        operator_delete(local_108);
      }
      return &this_00->super_SyntaxNode;
    }
    node_00 = slang::syntax::SyntaxNode::childNode(&node->super_SyntaxNode,index);
    if (node_00 == (SyntaxNode *)0x0) {
      slang::syntax::TypeAssignmentSyntax::getChild
                ((ConstTokenOrSyntax *)&local_168._M_first,node,index);
      if (local_158 == '\0') {
        local_168._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             slang::syntax::SyntaxNode::childToken(&node->super_SyntaxNode,index);
        _Var27._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             slang::parsing::Token::deepClone(&local_168._M_first._M_storage,this->alloc);
        child.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _16_8_ = (ulong)uStack_16f << 8;
        child.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             (_Uninitialized<slang::parsing::Token,_true>)_Var27;
        slang::syntax::TypeAssignmentSyntax::setChild(this_00,index,child);
      }
    }
    else {
      pCVar3 = this->commits;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = node_00;
      uVar23 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar16 = uVar23 >> ((byte)(pCVar3->insertBefore).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar4 = (pCVar3->insertBefore).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
               .arrays.groups_;
      lVar17 = (uVar23 & 0xff) * 4;
      uVar10 = (&UNK_009584ac)[lVar17];
      uVar11 = (&UNK_009584ad)[lVar17];
      uVar12 = (&UNK_009584ae)[lVar17];
      uVar13 = (&UNK_009584af)[lVar17];
      uVar22 = (uint)uVar23;
      uVar20 = 0;
      do {
        pgVar1 = pgVar4 + uVar16;
        auVar24[0] = -(pgVar1->m[0].n == uVar10);
        auVar24[1] = -(pgVar1->m[1].n == uVar11);
        auVar24[2] = -(pgVar1->m[2].n == uVar12);
        auVar24[3] = -(pgVar1->m[3].n == uVar13);
        auVar24[4] = -(pgVar1->m[4].n == uVar10);
        auVar24[5] = -(pgVar1->m[5].n == uVar11);
        auVar24[6] = -(pgVar1->m[6].n == uVar12);
        auVar24[7] = -(pgVar1->m[7].n == uVar13);
        auVar24[8] = -(pgVar1->m[8].n == uVar10);
        auVar24[9] = -(pgVar1->m[9].n == uVar11);
        auVar24[10] = -(pgVar1->m[10].n == uVar12);
        auVar24[0xb] = -(pgVar1->m[0xb].n == uVar13);
        auVar24[0xc] = -(pgVar1->m[0xc].n == uVar10);
        auVar24[0xd] = -(pgVar1->m[0xd].n == uVar11);
        auVar24[0xe] = -(pgVar1->m[0xe].n == uVar12);
        auVar24[0xf] = -(pgVar1->m[0xf].n == uVar13);
        uVar21 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
        if (uVar21 != 0) {
          ppVar5 = (pCVar3->insertBefore).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                   .arrays.elements_;
          do {
            iVar14 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
              }
            }
            if (node_00 ==
                *(SyntaxNode **)((long)&ppVar5[uVar16 * 0xf].first + (ulong)(uint)(iVar14 << 5))) {
              lVar17 = (long)&ppVar5[uVar16 * 0xf].first + (ulong)(uint)(iVar14 << 5);
              goto LAB_0072503a;
            }
            uVar21 = uVar21 - 1 & uVar21;
          } while (uVar21 != 0);
        }
        if ((pgVar4[uVar16].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[uVar22 & 7]) == 0) break;
        uVar6 = (pCVar3->insertBefore).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                .arrays.groups_size_mask;
        lVar17 = uVar16 + uVar20;
        uVar20 = uVar20 + 1;
        uVar16 = lVar17 + 1U & uVar6;
      } while (uVar20 <= uVar6);
      lVar17 = 0;
LAB_0072503a:
      if (lVar17 != 0) {
        plVar19 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar19,"Can\'t use insertBefore or insertAfter on a non-list node");
        __cxa_throw(plVar19,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar16 = uVar23 >> ((byte)(pCVar3->removeOrReplace).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar7 = (pCVar3->removeOrReplace).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
               .arrays.groups_;
      uVar20 = 0;
      do {
        pgVar2 = pgVar7 + uVar16;
        auVar25[0] = -(pgVar2->m[0].n == uVar10);
        auVar25[1] = -(pgVar2->m[1].n == uVar11);
        auVar25[2] = -(pgVar2->m[2].n == uVar12);
        auVar25[3] = -(pgVar2->m[3].n == uVar13);
        auVar25[4] = -(pgVar2->m[4].n == uVar10);
        auVar25[5] = -(pgVar2->m[5].n == uVar11);
        auVar25[6] = -(pgVar2->m[6].n == uVar12);
        auVar25[7] = -(pgVar2->m[7].n == uVar13);
        auVar25[8] = -(pgVar2->m[8].n == uVar10);
        auVar25[9] = -(pgVar2->m[9].n == uVar11);
        auVar25[10] = -(pgVar2->m[10].n == uVar12);
        auVar25[0xb] = -(pgVar2->m[0xb].n == uVar13);
        auVar25[0xc] = -(pgVar2->m[0xc].n == uVar10);
        auVar25[0xd] = -(pgVar2->m[0xd].n == uVar11);
        auVar25[0xe] = -(pgVar2->m[0xe].n == uVar12);
        auVar25[0xf] = -(pgVar2->m[0xf].n == uVar13);
        uVar21 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
        if (uVar21 != 0) {
          ppVar8 = (pCVar3->removeOrReplace).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                   .arrays.elements_;
          do {
            iVar14 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
              }
            }
            if (node_00 ==
                *(SyntaxNode **)((long)&ppVar8[uVar16 * 0xf].first + (ulong)(uint)(iVar14 * 0x30)))
            {
              lVar17 = (long)&ppVar8[uVar16 * 0xf].first + (ulong)(uint)(iVar14 * 0x30);
              goto LAB_007250f4;
            }
            uVar21 = uVar21 - 1 & uVar21;
          } while (uVar21 != 0);
        }
        if ((pgVar7[uVar16].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[uVar22 & 7]) == 0) break;
        uVar6 = (pCVar3->removeOrReplace).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::variant<slang::syntax::detail::RemoveChange,_slang::syntax::detail::ReplaceChange>_>_>_>
                .arrays.groups_size_mask;
        lVar17 = uVar16 + uVar20;
        uVar20 = uVar20 + 1;
        uVar16 = lVar17 + 1U & uVar6;
      } while (uVar20 <= uVar6);
      lVar17 = 0;
LAB_007250f4:
      if (lVar17 == 0) {
        local_150 = slang::syntax::detail::
                    visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::CloneVisitor>
                              (node_00,this);
        local_140 = 1;
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _17_7_ = uStack_13f;
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _M_index = 1;
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_first._M_storage.info = (Info *)uStack_148;
        child_00.super_ConstTokenOrSyntax.
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
        _M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_150;
        slang::syntax::TypeAssignmentSyntax::setChild(this_00,index,child_00);
      }
      else {
        if (*(char *)(lVar17 + 0x28) == '\x01') {
          local_120._M_rest = *(_Variadic_union<const_slang::syntax::SyntaxNode_*> *)(lVar17 + 0x10)
          ;
          p_Var18 = &local_120;
        }
        else {
          local_138._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
          p_Var18 = &local_138;
        }
        *(undefined1 *)&(&p_Var18->_M_first)[1]._M_storage.kind = EndOfFile;
        slang::syntax::TypeAssignmentSyntax::setChild
                  (this_00,index,
                   (ConstTokenOrSyntax)*(ConstTokenOrSyntax *)&(p_Var18->_M_first)._M_storage);
      }
      pCVar3 = this->commits;
      uVar23 = uVar23 >> ((byte)(pCVar3->insertAfter).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      pgVar4 = (pCVar3->insertAfter).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
               .arrays.groups_;
      uVar16 = 0;
      do {
        pgVar1 = pgVar4 + uVar23;
        auVar26[0] = -(pgVar1->m[0].n == uVar10);
        auVar26[1] = -(pgVar1->m[1].n == uVar11);
        auVar26[2] = -(pgVar1->m[2].n == uVar12);
        auVar26[3] = -(pgVar1->m[3].n == uVar13);
        auVar26[4] = -(pgVar1->m[4].n == uVar10);
        auVar26[5] = -(pgVar1->m[5].n == uVar11);
        auVar26[6] = -(pgVar1->m[6].n == uVar12);
        auVar26[7] = -(pgVar1->m[7].n == uVar13);
        auVar26[8] = -(pgVar1->m[8].n == uVar10);
        auVar26[9] = -(pgVar1->m[9].n == uVar11);
        auVar26[10] = -(pgVar1->m[10].n == uVar12);
        auVar26[0xb] = -(pgVar1->m[0xb].n == uVar13);
        auVar26[0xc] = -(pgVar1->m[0xc].n == uVar10);
        auVar26[0xd] = -(pgVar1->m[0xd].n == uVar11);
        auVar26[0xe] = -(pgVar1->m[0xe].n == uVar12);
        auVar26[0xf] = -(pgVar1->m[0xf].n == uVar13);
        uVar21 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
        if (uVar21 != 0) {
          ppVar5 = (pCVar3->insertAfter).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                   .arrays.elements_;
          do {
            iVar14 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
              }
            }
            if (node_00 ==
                *(SyntaxNode **)((long)&ppVar5[uVar23 * 0xf].first + (ulong)(uint)(iVar14 << 5))) {
              lVar17 = (long)&ppVar5[uVar23 * 0xf].first + (ulong)(uint)(iVar14 << 5);
              goto LAB_007252ca;
            }
            uVar21 = uVar21 - 1 & uVar21;
          } while (uVar21 != 0);
        }
        if ((pgVar4[uVar23].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[uVar22 & 7]) == 0) break;
        uVar20 = (pCVar3->insertAfter).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange>_>_>_>
                 .arrays.groups_size_mask;
        lVar17 = uVar23 + uVar16;
        uVar16 = uVar16 + 1;
        uVar23 = lVar17 + 1U & uVar20;
      } while (uVar16 <= uVar20);
      lVar17 = 0;
LAB_007252ca:
      if (lVar17 != 0) {
        plVar19 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar19,"Can\'t use insertBefore or insertAfter on a non-list node");
        __cxa_throw(plVar19,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

SyntaxNode* visit(const T& node) {
        T* cloned = clone(node, alloc);

        constexpr bool IsList = std::is_same_v<T, SyntaxListBase>;
        SmallVector<TokenOrSyntax, 8> listBuffer;
        bool skipSeparator = false;

        if constexpr (IsList) {
            if (auto it = commits.listInsertAtFront.find(&node);
                it != commits.listInsertAtFront.end()) {

                const SyntaxChange* lastChange = nullptr;
                for (const auto& change : it->second) {
                    if (!listBuffer.empty() && change.separator)
                        listBuffer.push_back(change.separator);
                    listBuffer.push_back(change.second);
                    lastChange = &change;
                }

                if (lastChange && node.getChildCount() && lastChange->separator)
                    listBuffer.push_back(lastChange->separator);
            }
        }

        for (size_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (!child) {
                if constexpr (IsList) {
                    if (!skipSeparator)
                        listBuffer.push_back(node.childToken(i).deepClone(alloc));
                    skipSeparator = false;
                }
                else {
                    if (node.getChild(i).isToken()) { // check since it might be null node
                        cloned->setChild(i, node.childToken(i).deepClone(alloc));
                    }
                }
                continue;
            }

            if (auto it = commits.insertBefore.find(child); it != commits.insertBefore.end()) {
                if (!IsList) {
                    SLANG_THROW(std::logic_error(
                        "Can't use insertBefore or insertAfter on a non-list node"));
                }

                for (const auto& change : it->second)
                    listBuffer.push_back(change.second);
            }

            if (auto it = commits.removeOrReplace.find(child);
                it != commits.removeOrReplace.end()) {
                if (auto replaceChange = std::get_if<ReplaceChange>(&it->second)) {
                    if constexpr (IsList)
                        listBuffer.push_back(replaceChange->second);
                    else
                        cloned->setChild(i, replaceChange->second);
                }
                else {
                    if constexpr (!IsList) {
                        static SyntaxNode* emptyNode = nullptr;
                        cloned->setChild(i, emptyNode);
                    }
                    else {
                        skipSeparator = true; // remove separator related to removed node
                    }
                }
            }
            else {
                if constexpr (IsList) {
                    listBuffer.push_back(child->visit(*this));
                }
                else {
                    cloned->setChild(i, child->visit(*this));
                }
            }

            if (auto it = commits.insertAfter.find(child); it != commits.insertAfter.end()) {
                if (!IsList) {
                    SLANG_THROW(std::logic_error(
                        "Can't use insertBefore or insertAfter on a non-list node"));
                }

                for (const auto& change : it->second)
                    listBuffer.push_back(change.second);
            }
        }

        if constexpr (IsList) {
            if (skipSeparator) {
                // remove trailing sep if it wasn't there before transform
                bool isClonedTrailing = !listBuffer.empty() && listBuffer.back().isToken();
                bool isOriginalTrailing = node.getChildCount() &&
                                          node.getChild(node.getChildCount() - 1).isToken();
                if (isClonedTrailing && !isOriginalTrailing)
                    listBuffer.pop_back();
            }
            if (auto it = commits.listInsertAtBack.find(&node);
                it != commits.listInsertAtBack.end()) {

                for (const auto& change : it->second) {
                    if (!listBuffer.empty() && change.separator)
                        listBuffer.push_back(change.separator);
                    listBuffer.push_back(change.second);
                }
            }

            cloned->resetAll(alloc, listBuffer);
        }

        return cloned;
    }